

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.cpp
# Opt level: O3

void __thiscall OpenMD::ForceFieldOptions::ForceFieldOptions(ForceFieldOptions *this)

{
  _Rb_tree_header *p_Var1;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  ParameterBase *local_210;
  ParameterBase *local_208;
  ParameterBase *local_200;
  string *local_1f8;
  ParameterBase *local_1f0;
  string *local_1e8;
  ParameterBase *local_1e0;
  string *local_1d8;
  ParameterBase *local_1d0;
  string *local_1c8;
  ParameterBase *local_1c0;
  string *local_1b8;
  ParameterBase *local_1b0;
  string *local_1a8;
  ParameterBase *local_1a0;
  string *local_198;
  ParameterBase *local_190;
  string *local_188;
  ParameterBase *local_180;
  string *local_178;
  ParameterBase *local_170;
  string *local_168;
  ParameterBase *local_160;
  ParameterBase *local_158;
  string *local_150;
  ParameterBase *local_148;
  string *local_140;
  ParameterBase *local_138;
  string *local_130;
  ParameterBase *local_128;
  string *local_120;
  ParameterBase *local_118;
  string *local_110;
  ParameterBase *local_108;
  string *local_100;
  ParameterBase *local_f8;
  string *local_f0;
  ParameterBase *local_e8;
  ParameterBase *local_e0;
  ParameterBase *local_d8;
  ParameterBase *local_d0;
  ParameterBase *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ForceFieldOptions_002f7920;
  (this->Name).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Name).super_ParameterBase.keyword_.field_2;
  (this->Name).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Name).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Name).super_ParameterBase.optional_ = false;
  (this->Name).super_ParameterBase.defaultValue_ = false;
  (this->Name).super_ParameterBase.empty_ = true;
  (this->Name).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_002f79e0;
  (this->Name).data_._M_dataplus._M_p = (pointer)&(this->Name).data_.field_2;
  (this->Name).data_._M_string_length = 0;
  (this->Name).data_.field_2._M_local_buf[0] = '\0';
  (this->vdWtype).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->vdWtype).super_ParameterBase.keyword_.field_2;
  (this->vdWtype).super_ParameterBase.keyword_._M_string_length = 0;
  (this->vdWtype).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->vdWtype).super_ParameterBase.optional_ = false;
  (this->vdWtype).super_ParameterBase.defaultValue_ = false;
  (this->vdWtype).super_ParameterBase.empty_ = true;
  (this->vdWtype).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_002f79e0;
  (this->vdWtype).data_._M_dataplus._M_p = (pointer)&(this->vdWtype).data_.field_2;
  (this->vdWtype).data_._M_string_length = 0;
  (this->vdWtype).data_.field_2._M_local_buf[0] = '\0';
  (this->DistanceMixingRule).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DistanceMixingRule).super_ParameterBase.keyword_.field_2;
  (this->DistanceMixingRule).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DistanceMixingRule).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DistanceMixingRule).super_ParameterBase.optional_ = false;
  (this->DistanceMixingRule).super_ParameterBase.defaultValue_ = false;
  (this->DistanceMixingRule).super_ParameterBase.empty_ = true;
  (this->DistanceMixingRule).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f79e0;
  (this->DistanceMixingRule).data_._M_dataplus._M_p =
       (pointer)&(this->DistanceMixingRule).data_.field_2;
  (this->DistanceMixingRule).data_._M_string_length = 0;
  (this->DistanceMixingRule).data_.field_2._M_local_buf[0] = '\0';
  (this->DistanceType).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DistanceType).super_ParameterBase.keyword_.field_2;
  (this->DistanceType).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DistanceType).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DistanceType).super_ParameterBase.optional_ = false;
  (this->DistanceType).super_ParameterBase.defaultValue_ = false;
  (this->DistanceType).super_ParameterBase.empty_ = true;
  (this->DistanceType).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f79e0;
  (this->DistanceType).data_._M_dataplus._M_p = (pointer)&(this->DistanceType).data_.field_2;
  (this->DistanceType).data_._M_string_length = 0;
  (this->DistanceType).data_.field_2._M_local_buf[0] = '\0';
  (this->EnergyMixingRule).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->EnergyMixingRule).super_ParameterBase.keyword_.field_2;
  (this->EnergyMixingRule).super_ParameterBase.keyword_._M_string_length = 0;
  (this->EnergyMixingRule).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->EnergyMixingRule).super_ParameterBase.optional_ = false;
  (this->EnergyMixingRule).super_ParameterBase.defaultValue_ = false;
  (this->EnergyMixingRule).super_ParameterBase.empty_ = true;
  (this->EnergyMixingRule).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f79e0;
  (this->EnergyMixingRule).data_._M_dataplus._M_p = (pointer)&(this->EnergyMixingRule).data_.field_2
  ;
  (this->EnergyMixingRule).data_._M_string_length = 0;
  (this->EnergyMixingRule).data_.field_2._M_local_buf[0] = '\0';
  local_38 = &(this->EnergyUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->EnergyUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_38;
  (this->EnergyUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->EnergyUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->EnergyUnitScaling).super_ParameterBase.optional_ = false;
  (this->EnergyUnitScaling).super_ParameterBase.defaultValue_ = false;
  (this->EnergyUnitScaling).super_ParameterBase.empty_ = true;
  (this->EnergyUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_40 = &(this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_40;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MetallicEnergyUnitScaling).super_ParameterBase.optional_ = false;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.defaultValue_ = false;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.empty_ = true;
  (this->MetallicEnergyUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_48 = &(this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_48;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] =
       '\0';
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.optional_ = false;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.defaultValue_ = false;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.empty_ = true;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_50 = &(this->DistanceUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->DistanceUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_50;
  (this->DistanceUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DistanceUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DistanceUnitScaling).super_ParameterBase.optional_ = false;
  (this->DistanceUnitScaling).super_ParameterBase.defaultValue_ = false;
  (this->DistanceUnitScaling).super_ParameterBase.empty_ = true;
  (this->DistanceUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_58 = &(this->AngleUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->AngleUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_58;
  (this->AngleUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AngleUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AngleUnitScaling).super_ParameterBase.optional_ = false;
  (this->AngleUnitScaling).super_ParameterBase.defaultValue_ = false;
  (this->AngleUnitScaling).super_ParameterBase.empty_ = true;
  (this->AngleUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_60 = &(this->ChargeUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->ChargeUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_60;
  (this->ChargeUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ChargeUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ChargeUnitScaling).super_ParameterBase.optional_ = false;
  (this->ChargeUnitScaling).super_ParameterBase.defaultValue_ = false;
  (this->ChargeUnitScaling).super_ParameterBase.empty_ = true;
  (this->ChargeUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_68 = &(this->OxidationStateScaling).super_ParameterBase.keyword_.field_2;
  (this->OxidationStateScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_68;
  (this->OxidationStateScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OxidationStateScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OxidationStateScaling).super_ParameterBase.optional_ = false;
  (this->OxidationStateScaling).super_ParameterBase.defaultValue_ = false;
  (this->OxidationStateScaling).super_ParameterBase.empty_ = true;
  (this->OxidationStateScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  (this->TorsionAngleConvention).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TorsionAngleConvention).super_ParameterBase.keyword_.field_2;
  (this->TorsionAngleConvention).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TorsionAngleConvention).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TorsionAngleConvention).super_ParameterBase.optional_ = false;
  (this->TorsionAngleConvention).super_ParameterBase.defaultValue_ = false;
  (this->TorsionAngleConvention).super_ParameterBase.empty_ = true;
  (this->TorsionAngleConvention).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f79e0;
  (this->TorsionAngleConvention).data_._M_dataplus._M_p =
       (pointer)&(this->TorsionAngleConvention).data_.field_2;
  (this->TorsionAngleConvention).data_._M_string_length = 0;
  (this->TorsionAngleConvention).data_.field_2._M_local_buf[0] = '\0';
  local_70 = &(this->vdw12scale).super_ParameterBase.keyword_.field_2;
  (this->vdw12scale).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_70;
  (this->vdw12scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->vdw12scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->vdw12scale).super_ParameterBase.optional_ = false;
  (this->vdw12scale).super_ParameterBase.defaultValue_ = false;
  (this->vdw12scale).super_ParameterBase.empty_ = true;
  (this->vdw12scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_78 = &(this->vdw13scale).super_ParameterBase.keyword_.field_2;
  (this->vdw13scale).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_78;
  (this->vdw13scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->vdw13scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->vdw13scale).super_ParameterBase.optional_ = false;
  (this->vdw13scale).super_ParameterBase.defaultValue_ = false;
  (this->vdw13scale).super_ParameterBase.empty_ = true;
  (this->vdw13scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_80 = &(this->vdw14scale).super_ParameterBase.keyword_.field_2;
  (this->vdw14scale).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_80;
  (this->vdw14scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->vdw14scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->vdw14scale).super_ParameterBase.optional_ = false;
  (this->vdw14scale).super_ParameterBase.defaultValue_ = false;
  (this->vdw14scale).super_ParameterBase.empty_ = true;
  (this->vdw14scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_88 = &(this->BondForceConstantScaling).super_ParameterBase.keyword_.field_2;
  (this->BondForceConstantScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_88
  ;
  (this->BondForceConstantScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BondForceConstantScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BondForceConstantScaling).super_ParameterBase.optional_ = false;
  (this->BondForceConstantScaling).super_ParameterBase.defaultValue_ = false;
  (this->BondForceConstantScaling).super_ParameterBase.empty_ = true;
  (this->BondForceConstantScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_90 = &(this->BendForceConstantScaling).super_ParameterBase.keyword_.field_2;
  (this->BendForceConstantScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_90
  ;
  (this->BendForceConstantScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BendForceConstantScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BendForceConstantScaling).super_ParameterBase.optional_ = false;
  (this->BendForceConstantScaling).super_ParameterBase.defaultValue_ = false;
  (this->BendForceConstantScaling).super_ParameterBase.empty_ = true;
  (this->BendForceConstantScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_98 = &(this->electrostatic12scale).super_ParameterBase.keyword_.field_2;
  (this->electrostatic12scale).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_98;
  (this->electrostatic12scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->electrostatic12scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->electrostatic12scale).super_ParameterBase.optional_ = false;
  (this->electrostatic12scale).super_ParameterBase.defaultValue_ = false;
  (this->electrostatic12scale).super_ParameterBase.empty_ = true;
  (this->electrostatic12scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_a0 = &(this->electrostatic13scale).super_ParameterBase.keyword_.field_2;
  (this->electrostatic13scale).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_a0;
  (this->electrostatic13scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->electrostatic13scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->electrostatic13scale).super_ParameterBase.optional_ = false;
  (this->electrostatic13scale).super_ParameterBase.defaultValue_ = false;
  (this->electrostatic13scale).super_ParameterBase.empty_ = true;
  (this->electrostatic13scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_a8 = &(this->electrostatic14scale).super_ParameterBase.keyword_.field_2;
  (this->electrostatic14scale).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_a8;
  (this->electrostatic14scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->electrostatic14scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->electrostatic14scale).super_ParameterBase.optional_ = false;
  (this->electrostatic14scale).super_ParameterBase.defaultValue_ = false;
  (this->electrostatic14scale).super_ParameterBase.empty_ = true;
  (this->electrostatic14scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_b0 = &(this->GayBerneMu).super_ParameterBase.keyword_.field_2;
  (this->GayBerneMu).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_b0;
  (this->GayBerneMu).super_ParameterBase.keyword_._M_string_length = 0;
  (this->GayBerneMu).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->GayBerneMu).super_ParameterBase.optional_ = false;
  (this->GayBerneMu).super_ParameterBase.defaultValue_ = false;
  (this->GayBerneMu).super_ParameterBase.empty_ = true;
  (this->GayBerneMu).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  local_b8 = &(this->GayBerneNu).super_ParameterBase.keyword_.field_2;
  (this->GayBerneNu).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_b8;
  (this->GayBerneNu).super_ParameterBase.keyword_._M_string_length = 0;
  (this->GayBerneNu).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->GayBerneNu).super_ParameterBase.optional_ = false;
  (this->GayBerneNu).super_ParameterBase.defaultValue_ = false;
  (this->GayBerneNu).super_ParameterBase.empty_ = true;
  (this->GayBerneNu).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8338;
  (this->EAMMixingMethod).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->EAMMixingMethod).super_ParameterBase.keyword_.field_2;
  (this->EAMMixingMethod).super_ParameterBase.keyword_._M_string_length = 0;
  (this->EAMMixingMethod).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->EAMMixingMethod).super_ParameterBase.optional_ = false;
  (this->EAMMixingMethod).super_ParameterBase.defaultValue_ = false;
  (this->EAMMixingMethod).super_ParameterBase.empty_ = true;
  (this->EAMMixingMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f79e0;
  (this->EAMMixingMethod).data_._M_dataplus._M_p = (pointer)&(this->EAMMixingMethod).data_.field_2;
  (this->EAMMixingMethod).data_._M_string_length = 0;
  (this->EAMMixingMethod).data_.field_2._M_local_buf[0] = '\0';
  local_c0 = &(this->DelayedParameterCalculation).super_ParameterBase.keyword_.field_2;
  (this->DelayedParameterCalculation).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_c0;
  (this->DelayedParameterCalculation).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DelayedParameterCalculation).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DelayedParameterCalculation).super_ParameterBase.optional_ = false;
  (this->DelayedParameterCalculation).super_ParameterBase.defaultValue_ = false;
  (this->DelayedParameterCalculation).super_ParameterBase.empty_ = true;
  (this->DelayedParameterCalculation).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f82c0;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->parameters_)._M_t._M_impl.super__Rb_tree_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &local_258.first.field_2;
  local_c8 = &(this->Name).super_ParameterBase;
  local_d0 = &(this->vdWtype).super_ParameterBase;
  local_d8 = &(this->DistanceMixingRule).super_ParameterBase;
  local_e0 = &(this->DistanceType).super_ParameterBase;
  local_e8 = &(this->EnergyMixingRule).super_ParameterBase;
  local_f8 = &(this->EnergyUnitScaling).super_ParameterBase;
  local_f0 = (string *)&(this->EnergyUnitScaling).super_ParameterBase.keyword_;
  local_108 = &(this->MetallicEnergyUnitScaling).super_ParameterBase;
  local_100 = (string *)&(this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_;
  local_118 = &(this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase;
  local_110 = (string *)&(this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_;
  local_128 = &(this->DistanceUnitScaling).super_ParameterBase;
  local_120 = (string *)&(this->DistanceUnitScaling).super_ParameterBase.keyword_;
  local_138 = &(this->AngleUnitScaling).super_ParameterBase;
  local_130 = (string *)&(this->AngleUnitScaling).super_ParameterBase.keyword_;
  local_148 = &(this->ChargeUnitScaling).super_ParameterBase;
  local_140 = (string *)&(this->ChargeUnitScaling).super_ParameterBase.keyword_;
  local_158 = &(this->OxidationStateScaling).super_ParameterBase;
  local_150 = (string *)&(this->OxidationStateScaling).super_ParameterBase.keyword_;
  local_160 = &(this->TorsionAngleConvention).super_ParameterBase;
  local_170 = &(this->vdw12scale).super_ParameterBase;
  local_168 = (string *)&(this->vdw12scale).super_ParameterBase.keyword_;
  local_180 = &(this->vdw13scale).super_ParameterBase;
  local_178 = (string *)&(this->vdw13scale).super_ParameterBase.keyword_;
  local_190 = &(this->vdw14scale).super_ParameterBase;
  local_188 = (string *)&(this->vdw14scale).super_ParameterBase.keyword_;
  local_1d0 = &(this->BondForceConstantScaling).super_ParameterBase;
  local_1c8 = (string *)&(this->BondForceConstantScaling).super_ParameterBase.keyword_;
  local_1e0 = &(this->BendForceConstantScaling).super_ParameterBase;
  local_1d8 = (string *)&(this->BendForceConstantScaling).super_ParameterBase.keyword_;
  local_1a0 = &(this->electrostatic12scale).super_ParameterBase;
  local_198 = (string *)&(this->electrostatic12scale).super_ParameterBase.keyword_;
  local_1b0 = &(this->electrostatic13scale).super_ParameterBase;
  local_1a8 = (string *)&(this->electrostatic13scale).super_ParameterBase.keyword_;
  local_1c0 = &(this->electrostatic14scale).super_ParameterBase;
  local_1b8 = (string *)&(this->electrostatic14scale).super_ParameterBase.keyword_;
  local_1f0 = &(this->GayBerneMu).super_ParameterBase;
  local_1e8 = (string *)&(this->GayBerneMu).super_ParameterBase.keyword_;
  local_200 = &(this->GayBerneNu).super_ParameterBase;
  local_1f8 = (string *)&(this->GayBerneNu).super_ParameterBase.keyword_;
  local_208 = &(this->EAMMixingMethod).super_ParameterBase;
  local_210 = &(this->DelayedParameterCalculation).super_ParameterBase;
  this_00 = &this->parameters_;
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Name","");
  std::__cxx11::string::_M_assign((string *)&(this->Name).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->Name).super_ParameterBase.optional_ = true;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Name","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_c8;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"vdWtype","");
  std::__cxx11::string::_M_assign((string *)&(this->vdWtype).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->vdWtype).super_ParameterBase.optional_ = true;
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Lennard-Jones","");
  std::__cxx11::string::_M_assign((string *)&(this->vdWtype).data_);
  (this->vdWtype).super_ParameterBase.defaultValue_ = true;
  (this->vdWtype).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vdWtype","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_d0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"DistanceMixingRule","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->DistanceMixingRule).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->DistanceMixingRule).super_ParameterBase.optional_ = true;
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"arithmetic","");
  std::__cxx11::string::_M_assign((string *)&(this->DistanceMixingRule).data_);
  (this->DistanceMixingRule).super_ParameterBase.defaultValue_ = true;
  (this->DistanceMixingRule).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"DistanceMixingRule","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_d8;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"DistanceType","");
  std::__cxx11::string::_M_assign((string *)&(this->DistanceType).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->DistanceType).super_ParameterBase.optional_ = true;
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"sigma","");
  std::__cxx11::string::_M_assign((string *)&(this->DistanceType).data_);
  (this->DistanceType).super_ParameterBase.defaultValue_ = true;
  (this->DistanceType).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"DistanceType","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_e0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"EnergyMixingRule","");
  std::__cxx11::string::_M_assign((string *)&(this->EnergyMixingRule).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->EnergyMixingRule).super_ParameterBase.optional_ = true;
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"geometric","");
  std::__cxx11::string::_M_assign((string *)&(this->EnergyMixingRule).data_);
  (this->EnergyMixingRule).super_ParameterBase.defaultValue_ = true;
  (this->EnergyMixingRule).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"EnergyMixingRule","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_e8;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"EnergyUnitScaling","");
  std::__cxx11::string::_M_assign(local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->EnergyUnitScaling).super_ParameterBase.optional_ = true;
  (this->EnergyUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->EnergyUnitScaling).data_ = 1.0;
  (this->EnergyUnitScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"EnergyUnitScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_f8;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"MetallicEnergyUnitScaling","");
  std::__cxx11::string::_M_assign(local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->MetallicEnergyUnitScaling).super_ParameterBase.optional_ = true;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->MetallicEnergyUnitScaling).data_ = 1.0;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"MetallicEnergyUnitScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_108;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"FluctuatingChargeEnergyUnitScaling","");
  std::__cxx11::string::_M_assign(local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.optional_ = true;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->FluctuatingChargeEnergyUnitScaling).data_ = 1.0;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"FluctuatingChargeEnergyUnitScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_118;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"DistanceUnitScaling","");
  std::__cxx11::string::_M_assign(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->DistanceUnitScaling).super_ParameterBase.optional_ = true;
  (this->DistanceUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->DistanceUnitScaling).data_ = 1.0;
  (this->DistanceUnitScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"DistanceUnitScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_128;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"AngleUnitScaling","");
  std::__cxx11::string::_M_assign(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->AngleUnitScaling).super_ParameterBase.optional_ = true;
  (this->AngleUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->AngleUnitScaling).data_ = 1.0;
  (this->AngleUnitScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"AngleUnitScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_138;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"ChargeUnitScaling","");
  std::__cxx11::string::_M_assign(local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->ChargeUnitScaling).super_ParameterBase.optional_ = true;
  (this->ChargeUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->ChargeUnitScaling).data_ = 1.0;
  (this->ChargeUnitScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"ChargeUnitScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_148;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"OxidationStateScaling","");
  std::__cxx11::string::_M_assign(local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->OxidationStateScaling).super_ParameterBase.optional_ = true;
  (this->OxidationStateScaling).super_ParameterBase.defaultValue_ = true;
  (this->OxidationStateScaling).data_ = 1.0;
  (this->OxidationStateScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"OxidationStateScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_158;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"TorsionAngleConvention","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->TorsionAngleConvention).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->TorsionAngleConvention).super_ParameterBase.optional_ = true;
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"180_is_trans","");
  std::__cxx11::string::_M_assign((string *)&(this->TorsionAngleConvention).data_);
  (this->TorsionAngleConvention).super_ParameterBase.defaultValue_ = true;
  (this->TorsionAngleConvention).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"TorsionAngleConvention","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_160;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"vdW-12-scale","");
  std::__cxx11::string::_M_assign(local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->vdw12scale).super_ParameterBase.optional_ = true;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vdW-12-scale","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_170;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"vdW-13-scale","");
  std::__cxx11::string::_M_assign(local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->vdw13scale).super_ParameterBase.optional_ = true;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vdW-13-scale","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_180;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"vdW-14-scale","");
  std::__cxx11::string::_M_assign(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->vdw14scale).super_ParameterBase.optional_ = true;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vdW-14-scale","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_190;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"electrostatic-12-scale","");
  std::__cxx11::string::_M_assign(local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->electrostatic12scale).super_ParameterBase.optional_ = true;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"electrostatic-12-scale","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_1a0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"electrostatic-13-scale","");
  std::__cxx11::string::_M_assign(local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->electrostatic13scale).super_ParameterBase.optional_ = true;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"electrostatic-13-scale","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_1b0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"electrostatic-14-scale","");
  std::__cxx11::string::_M_assign(local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->electrostatic14scale).super_ParameterBase.optional_ = true;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"electrostatic-14-scale","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_1c0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"BondForceConstantScaling","");
  std::__cxx11::string::_M_assign(local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->BondForceConstantScaling).super_ParameterBase.optional_ = true;
  (this->BondForceConstantScaling).super_ParameterBase.defaultValue_ = true;
  (this->BondForceConstantScaling).data_ = 1.0;
  (this->BondForceConstantScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"BondForceConstantScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_1d0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"BendForceConstantScaling","");
  std::__cxx11::string::_M_assign(local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->BendForceConstantScaling).super_ParameterBase.optional_ = true;
  (this->BendForceConstantScaling).super_ParameterBase.defaultValue_ = true;
  (this->BendForceConstantScaling).data_ = 1.0;
  (this->BendForceConstantScaling).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"BendForceConstantScaling","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_1e0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"GayBerneMu","");
  std::__cxx11::string::_M_assign(local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->GayBerneMu).super_ParameterBase.optional_ = true;
  (this->GayBerneMu).super_ParameterBase.defaultValue_ = true;
  (this->GayBerneMu).data_ = 2.0;
  (this->GayBerneMu).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"GayBerneMu","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_1f0;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"GayBerneNu","");
  std::__cxx11::string::_M_assign(local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->GayBerneNu).super_ParameterBase.optional_ = true;
  (this->GayBerneNu).super_ParameterBase.defaultValue_ = true;
  (this->GayBerneNu).data_ = 1.0;
  (this->GayBerneNu).super_ParameterBase.empty_ = false;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"GayBerneNu","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_200;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"EAMMixingMethod","");
  std::__cxx11::string::_M_assign((string *)&(this->EAMMixingMethod).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->EAMMixingMethod).super_ParameterBase.optional_ = true;
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Johnson","");
  std::__cxx11::string::_M_assign((string *)&(this->EAMMixingMethod).data_);
  (this->EAMMixingMethod).super_ParameterBase.defaultValue_ = true;
  (this->EAMMixingMethod).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"EAMMixingMethod","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_208;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"delayedParameterCalculation","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->DelayedParameterCalculation).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  (this->DelayedParameterCalculation).super_ParameterBase.optional_ = true;
  (this->DelayedParameterCalculation).super_ParameterBase.defaultValue_ = true;
  (this->DelayedParameterCalculation).super_ParameterBase.empty_ = false;
  (this->DelayedParameterCalculation).super_ParameterBase.field_0x2b = 0;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"delayedParameterCalculation","");
  if (local_230 == &local_220) {
    local_258.first.field_2._8_8_ = local_220._8_8_;
    local_258.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.first._M_dataplus._M_p = (pointer)local_230;
  }
  local_258.first.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_258.first.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_258.first._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258.second = local_210;
  local_230 = &local_220;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  local_258.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"cutoffPolicy","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_DataHolder).deprecatedKeywords_,&local_258.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.first._M_dataplus._M_p,
                    local_258.first.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ForceFieldOptions::ForceFieldOptions() {
    DefineOptionalParameter(Name, "Name");
    DefineOptionalParameterWithDefaultValue(vdWtype, "vdWtype",
                                            "Lennard-Jones");
    DefineOptionalParameterWithDefaultValue(DistanceMixingRule,
                                            "DistanceMixingRule", "arithmetic");
    DefineOptionalParameterWithDefaultValue(DistanceType, "DistanceType",
                                            "sigma");
    DefineOptionalParameterWithDefaultValue(EnergyMixingRule,
                                            "EnergyMixingRule", "geometric");
    DefineOptionalParameterWithDefaultValue(EnergyUnitScaling,
                                            "EnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(MetallicEnergyUnitScaling,
                                            "MetallicEnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(
        FluctuatingChargeEnergyUnitScaling,
        "FluctuatingChargeEnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(DistanceUnitScaling,
                                            "DistanceUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(AngleUnitScaling,
                                            "AngleUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(ChargeUnitScaling,
                                            "ChargeUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(OxidationStateScaling,
                                            "OxidationStateScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(
        TorsionAngleConvention, "TorsionAngleConvention", "180_is_trans");
    DefineOptionalParameter(vdw12scale, "vdW-12-scale");
    DefineOptionalParameter(vdw13scale, "vdW-13-scale");
    DefineOptionalParameter(vdw14scale, "vdW-14-scale");
    DefineOptionalParameter(electrostatic12scale, "electrostatic-12-scale");
    DefineOptionalParameter(electrostatic13scale, "electrostatic-13-scale");
    DefineOptionalParameter(electrostatic14scale, "electrostatic-14-scale");
    DefineOptionalParameterWithDefaultValue(BondForceConstantScaling,
                                            "BondForceConstantScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(BendForceConstantScaling,
                                            "BendForceConstantScaling", 1.0);

    // DefineOptionalParameterWithDefaultValue(vdw12scale, "vdW-12-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(vdw13scale, "vdW-13-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(vdw14scale, "vdW-14-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic12scale,
    // "electrostatic-12-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic13scale,
    // "electrostatic-13-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic14scale,
    // "electrostatic-14-scale", 0.0);
    DefineOptionalParameterWithDefaultValue(GayBerneMu, "GayBerneMu", 2.0);
    DefineOptionalParameterWithDefaultValue(GayBerneNu, "GayBerneNu", 1.0);
    DefineOptionalParameterWithDefaultValue(EAMMixingMethod, "EAMMixingMethod",
                                            "Johnson");
    DefineOptionalParameterWithDefaultValue(
        DelayedParameterCalculation, "delayedParameterCalculation", false);

    deprecatedKeywords_.insert("cutoffPolicy");
  }